

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_seek_test(void)

{
  uint32_t *__s;
  void *pvVar1;
  void *pvVar2;
  wal_item *pwVar3;
  void *pvVar4;
  fdb_file_handle *handle;
  fdb_kvs_handle *pfVar5;
  fdb_iterator *pfVar6;
  fdb_status fVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  void **doc;
  char *pcVar13;
  fdb_doc **doc_00;
  ulong uVar14;
  undefined1 auStack_10458 [65384];
  undefined8 uStack_4f0;
  undefined1 local_4d0 [8];
  fdb_config fconfig;
  char metabuf [256];
  char bodybuf [256];
  char keybuf [256];
  undefined1 local_d0 [8];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_doc *local_a0;
  void *local_98 [2];
  long local_88;
  long local_68;
  long local_60;
  fdb_kvs_handle *local_58;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  
  gettimeofday((timeval *)local_d0,(__timezone_ptr_t)0x0);
  memleak_start();
  iterator = (fdb_iterator *)0x0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.wal_threshold._4_4_ = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.purging_interval = fconfig.wal_threshold._4_4_;
  fdb_open((fdb_file_handle **)&kv1,"./iterator_test1",(fdb_config *)local_4d0);
  fdb_kvs_open_default
            ((fdb_file_handle *)kv1,(fdb_kvs_handle **)&dbfile,
             (fdb_kvs_config *)&__test_begin.tv_usec);
  fVar7 = fdb_set_log_callback((fdb_kvs_handle *)dbfile,logCallbackFunc,"iterator_seek_test");
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x209);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x209,"void iterator_seek_test()");
  }
  fVar7 = fdb_kvs_open((fdb_file_handle *)kv1,&local_58,"kv1",
                       (fdb_kvs_config *)&__test_begin.tv_usec);
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x20d);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x20d,"void iterator_seek_test()");
  }
  lVar12 = 0;
  for (uVar14 = 0; uVar14 != 10; uVar14 = uVar14 + 1) {
    sprintf(bodybuf + 0xf8,"kEy%d",uVar14 & 0xffffffff);
    sprintf((char *)&fconfig.num_blocks_readahead,"mEta%d",uVar14 & 0xffffffff);
    sprintf(metabuf + 0xf8,"bOdy%d",uVar14 & 0xffffffff);
    sVar9 = strlen(bodybuf + 0xf8);
    sVar10 = strlen((char *)&fconfig.num_blocks_readahead);
    sVar11 = strlen(metabuf + 0xf8);
    uStack_4f0 = 0x106064;
    fdb_doc_create((fdb_doc **)((long)&kvs_config.custom_cmp_param + lVar12),bodybuf + 0xf8,sVar9,
                   &fconfig.num_blocks_readahead,sVar10,metabuf + 0xf8,sVar11);
    fVar7 = fdb_set(local_58,(fdb_doc *)(&kvs_config.custom_cmp_param)[uVar14]);
    if (fVar7 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x217);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x217,"void iterator_seek_test()");
    }
    fdb_doc_free((fdb_doc *)(&kvs_config.custom_cmp_param)[uVar14]);
    lVar12 = lVar12 + 8;
  }
  doc_00 = &local_a0;
  for (uVar14 = 1; uVar14 < 10; uVar14 = uVar14 + 2) {
    sprintf(bodybuf + 0xf8,"key%d",uVar14 & 0xffffffff);
    sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",uVar14 & 0xffffffff);
    sprintf(metabuf + 0xf8,"body%d",uVar14 & 0xffffffff);
    sVar9 = strlen(bodybuf + 0xf8);
    sVar10 = strlen((char *)&fconfig.num_blocks_readahead);
    sVar11 = strlen(metabuf + 0xf8);
    uStack_4f0 = 0x106144;
    fdb_doc_create(doc_00,bodybuf + 0xf8,sVar9,&fconfig.num_blocks_readahead,sVar10,metabuf + 0xf8,
                   sVar11);
    fdb_set((fdb_kvs_handle *)dbfile,*doc_00);
    doc_00 = doc_00 + 2;
  }
  fdb_commit((fdb_file_handle *)kv1,'\x01');
  doc = &kvs_config.custom_cmp_param;
  for (uVar14 = 0; uVar14 < 10; uVar14 = uVar14 + 2) {
    sprintf(bodybuf + 0xf8,"key%d",uVar14 & 0xffffffff);
    sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",uVar14 & 0xffffffff);
    pcVar13 = metabuf + 0xf8;
    sprintf(pcVar13,"body%d",uVar14 & 0xffffffff);
    sVar9 = strlen(bodybuf + 0xf8);
    sVar10 = strlen((char *)&fconfig.num_blocks_readahead);
    sVar11 = strlen(pcVar13);
    uStack_4f0 = 0x106212;
    fdb_doc_create((fdb_doc **)doc,bodybuf + 0xf8,sVar9,&fconfig.num_blocks_readahead,sVar10,pcVar13
                   ,sVar11);
    fdb_set((fdb_kvs_handle *)dbfile,(fdb_doc *)*doc);
    doc = doc + 2;
  }
  fdb_commit((fdb_file_handle *)kv1,'\0');
  uStack_4f0 = 0x106258;
  fdb_iterator_init((fdb_kvs_handle *)dbfile,(fdb_iterator **)&db,(void *)0x0,0,(void *)0x0,0,0);
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  pvVar4 = kvs_config.custom_cmp_param;
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x23a);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x23a,"void iterator_seek_test()");
  }
  pvVar1 = (void *)iterator->_seqnum;
  pvVar2 = *(void **)((long)kvs_config.custom_cmp_param + 0x20);
  iVar8 = bcmp(pvVar1,pvVar2,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x23c);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x23c,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar1 = *(void **)((long)pvVar4 + 0x38);
  iVar8 = bcmp(pwVar3,pvVar1,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x23d);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x23d,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)((long)pvVar4 + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x23e);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x23e,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  pfVar5 = db;
  iterator = (fdb_iterator *)0x0;
  pvVar4 = *(void **)((long)local_98[0] + 0x20);
  sVar9 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar5,pvVar4,sVar9,'\0');
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x245);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x245,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  pvVar4 = local_98[0];
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x247);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x247,"void iterator_seek_test()");
  }
  pvVar1 = (void *)iterator->_seqnum;
  pvVar2 = *(void **)((long)local_98[0] + 0x20);
  iVar8 = bcmp(pvVar1,pvVar2,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x249);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x249,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar1 = *(void **)((long)pvVar4 + 0x38);
  iVar8 = bcmp(pwVar3,pvVar1,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x24a);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x24a,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)((long)pvVar4 + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x24b);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x24b,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_next((fdb_iterator *)db);
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x251);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x251,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  pvVar4 = local_98[1];
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x253);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x253,"void iterator_seek_test()");
  }
  pvVar1 = (void *)iterator->_seqnum;
  pvVar2 = *(void **)((long)local_98[1] + 0x20);
  iVar8 = bcmp(pvVar1,pvVar2,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x256);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x256,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar1 = *(void **)((long)pvVar4 + 0x38);
  iVar8 = bcmp(pwVar3,pvVar1,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,599);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,599,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)((long)pvVar4 + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,600);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,600,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  pfVar5 = db;
  iterator = (fdb_iterator *)0x0;
  pvVar4 = *(void **)(local_60 + 0x20);
  sVar9 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar5,pvVar4,sVar9,'\0');
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x25e);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x25e,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  lVar12 = local_60;
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x260);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x260,"void iterator_seek_test()");
  }
  pvVar4 = (void *)iterator->_seqnum;
  pvVar1 = *(void **)(local_60 + 0x20);
  iVar8 = bcmp(pvVar4,pvVar1,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pvVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x262);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x262,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar4 = *(void **)(lVar12 + 0x38);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x263);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x263,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)(lVar12 + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x264);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x264,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  pfVar5 = db;
  iterator = (fdb_iterator *)0x0;
  pvVar4 = *(void **)((long)kvs_config.custom_cmp_param + 0x20);
  sVar9 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar5,pvVar4,sVar9,'\0');
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x26b);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x26b,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  pvVar4 = kvs_config.custom_cmp_param;
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x26d);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x26d,"void iterator_seek_test()");
  }
  pvVar1 = (void *)iterator->_seqnum;
  pvVar2 = *(void **)((long)kvs_config.custom_cmp_param + 0x20);
  iVar8 = bcmp(pvVar1,pvVar2,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x26f);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x26f,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar1 = *(void **)((long)pvVar4 + 0x38);
  iVar8 = bcmp(pwVar3,pvVar1,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x270);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x270,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)((long)pvVar4 + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x271);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x271,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  pfVar5 = db;
  iterator = (fdb_iterator *)0x0;
  pvVar4 = *(void **)((long)local_98[0] + 0x20);
  sVar9 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar5,pvVar4,sVar9,'\0');
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x277);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x277,"void iterator_seek_test()");
  }
  lVar12 = 2;
  do {
    fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
    pfVar6 = iterator;
    if (fVar7 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x27c);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x27c,"void iterator_seek_test()");
    }
    pvVar4 = (void *)iterator->_seqnum;
    pvVar1 = (&kvs_config.custom_cmp_param)[lVar12];
    pvVar2 = *(void **)((long)pvVar1 + 0x20);
    iVar8 = bcmp(pvVar4,pvVar2,(size_t)iterator->handle);
    if (iVar8 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x27e);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x27e,"void iterator_seek_test()");
    }
    pwVar3 = pfVar6->tree_cursor_start;
    pvVar4 = *(void **)((long)pvVar1 + 0x38);
    iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->hbtrie_iterator);
    if (iVar8 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x27f);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x27f,"void iterator_seek_test()");
    }
    pwVar3 = pfVar6->tree_cursor_prev;
    pvVar4 = *(void **)((long)pvVar1 + 0x40);
    iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
    if (iVar8 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x280);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x280,"void iterator_seek_test()");
    }
    fdb_doc_free((fdb_doc *)pfVar6);
    iterator = (fdb_iterator *)0x0;
    lVar12 = lVar12 + 1;
    fVar7 = fdb_iterator_next((fdb_iterator *)db);
    pfVar5 = db;
  } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
  if (lVar12 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x286);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("i==10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x286,"void iterator_seek_test()");
  }
  pvVar4 = *(void **)((long)local_98[1] + 0x20);
  sVar9 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar5,pvVar4,sVar9,'\0');
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x28a);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x28a,"void iterator_seek_test()");
  }
  lVar12 = 3;
  do {
    fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
    pfVar6 = iterator;
    if (fVar7 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x28f);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x28f,"void iterator_seek_test()");
    }
    pvVar4 = (void *)iterator->_seqnum;
    pvVar1 = (&kvs_config.custom_cmp_param)[lVar12];
    pvVar2 = *(void **)((long)pvVar1 + 0x20);
    iVar8 = bcmp(pvVar4,pvVar2,(size_t)iterator->handle);
    if (iVar8 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x291);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x291,"void iterator_seek_test()");
    }
    pwVar3 = pfVar6->tree_cursor_start;
    pvVar4 = *(void **)((long)pvVar1 + 0x38);
    iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->hbtrie_iterator);
    if (iVar8 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x292);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x292,"void iterator_seek_test()");
    }
    pwVar3 = pfVar6->tree_cursor_prev;
    pvVar4 = *(void **)((long)pvVar1 + 0x40);
    iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
    if (iVar8 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x293);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x293,"void iterator_seek_test()");
    }
    fdb_doc_free((fdb_doc *)pfVar6);
    iterator = (fdb_iterator *)0x0;
    lVar12 = lVar12 + 1;
    fVar7 = fdb_iterator_next((fdb_iterator *)db);
  } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
  if (lVar12 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x299);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("i==10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x299,"void iterator_seek_test()");
  }
  fdb_iterator_close((fdb_iterator *)db);
  pcVar13 = bodybuf + 0xf8;
  sprintf(pcVar13,"key%d",4);
  __s = &fconfig.num_blocks_readahead;
  sprintf((char *)__s,"key%d",8);
  handle = dbfile;
  sVar9 = strlen(pcVar13);
  sVar10 = strlen((char *)__s);
  uStack_4f0 = 0x1067f2;
  fVar7 = fdb_iterator_init((fdb_kvs_handle *)handle,(fdb_iterator **)&db,pcVar13,sVar9,__s,sVar10,2
                           );
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2a4);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2a4,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)db);
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2a7);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2a7,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2a9);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2a9,"void iterator_seek_test()");
  }
  pvVar4 = (void *)iterator->_seqnum;
  pvVar1 = *(void **)(local_68 + 0x20);
  iVar8 = bcmp(pvVar4,pvVar1,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pvVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2ab);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2ab,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar4 = *(void **)(local_68 + 0x38);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2ac);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2ac,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)(local_68 + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2ad);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2ad,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_seek_to_min((fdb_iterator *)db);
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2b4);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2b4,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2b6);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2b6,"void iterator_seek_test()");
  }
  pvVar4 = (void *)iterator->_seqnum;
  pvVar1 = *(void **)(local_88 + 0x20);
  iVar8 = bcmp(pvVar4,pvVar1,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pvVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2b8);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2b8,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar4 = *(void **)(local_88 + 0x38);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2b9);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2b9,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)(local_88 + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2ba);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2ba,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_close((fdb_iterator *)db);
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2bf);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2bf,"void iterator_seek_test()");
  }
  uStack_4f0 = 0x106962;
  fVar7 = fdb_iterator_init((fdb_kvs_handle *)dbfile,(fdb_iterator **)&db,(void *)0x0,0,(void *)0x0,
                            0,0);
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2c3);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2c3,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)db);
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2c7);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2c7,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  lVar12 = local_60;
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2c9);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2c9,"void iterator_seek_test()");
  }
  pvVar4 = (void *)iterator->_seqnum;
  pvVar1 = *(void **)(local_60 + 0x20);
  iVar8 = bcmp(pvVar4,pvVar1,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pvVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2cb);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2cb,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar4 = *(void **)(lVar12 + 0x38);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2cc);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2cc,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)(lVar12 + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2cd);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2cd,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_seek_to_min((fdb_iterator *)db);
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2d4);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2d4,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2d6);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2d6,"void iterator_seek_test()");
  }
  pvVar4 = (void *)iterator->_seqnum;
  pvVar1 = *(void **)((long)kvs_config.custom_cmp_param + 0x20);
  iVar8 = bcmp(pvVar4,pvVar1,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pvVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2d8);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2d8,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar4 = *(void **)((long)kvs_config.custom_cmp_param + 0x38);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2d9);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2d9,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)((long)kvs_config.custom_cmp_param + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2da);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2da,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  iterator = (fdb_iterator *)0x0;
  memset(auStack_10458,0xff,0xff80);
  fVar7 = fdb_iterator_seek((fdb_iterator *)db,auStack_10458,0xff80,'\x01');
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2e4);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2e4,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2e7);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2e7,"void iterator_seek_test()");
  }
  pvVar4 = (void *)iterator->_seqnum;
  pvVar1 = *(void **)(local_60 + 0x20);
  iVar8 = bcmp(pvVar4,pvVar1,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pvVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2e9);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2e9,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar4 = *(void **)(local_60 + 0x38);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2ea);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2ea,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)(local_60 + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2eb);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2eb,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_close((fdb_iterator *)db);
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2f1);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2f1,"void iterator_seek_test()");
  }
  uVar14 = 0;
  while (uVar14 < 10) {
    fVar7 = fdb_del((fdb_kvs_handle *)dbfile,(fdb_doc *)(&kvs_config.custom_cmp_param)[uVar14]);
    uVar14 = uVar14 + 2;
    if (fVar7 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x2f6);
      iterator_seek_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2f6,"void iterator_seek_test()");
    }
  }
  fdb_commit((fdb_file_handle *)kv1,'\0');
  fdb_iterator_init((fdb_kvs_handle *)dbfile,(fdb_iterator **)&db,(void *)0x0,0,(void *)0x0,0,0);
  pfVar5 = db;
  iterator = (fdb_iterator *)0x0;
  pvVar4 = *(void **)((long)local_98[0] + 0x20);
  sVar9 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar5,pvVar4,sVar9,'\0');
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x302);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x302,"void iterator_seek_test()");
  }
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar6 = iterator;
  if (fVar7 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x304);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x304,"void iterator_seek_test()");
  }
  pvVar4 = (void *)iterator->_seqnum;
  pvVar1 = *(void **)((long)local_98[0] + 0x20);
  iVar8 = bcmp(pvVar4,pvVar1,(size_t)iterator->handle);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,pvVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x306);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x306,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_start;
  pvVar4 = *(void **)((long)local_98[0] + 0x38);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->hbtrie_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x307);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x307,"void iterator_seek_test()");
  }
  pwVar3 = pfVar6->tree_cursor_prev;
  pvVar4 = *(void **)((long)local_98[0] + 0x40);
  iVar8 = bcmp(pwVar3,pvVar4,(size_t)pfVar6->seqtree_iterator);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pwVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x308);
    iterator_seek_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x308,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)pfVar6);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_close((fdb_iterator *)db);
  if (fVar7 == FDB_RESULT_SUCCESS) {
    fdb_kvs_close(local_58);
    fdb_kvs_close((fdb_kvs_handle *)dbfile);
    fdb_close((fdb_file_handle *)kv1);
    for (lVar12 = 0; lVar12 != 10; lVar12 = lVar12 + 1) {
      fdb_doc_free((fdb_doc *)(&kvs_config.custom_cmp_param)[lVar12]);
    }
    fdb_shutdown();
    memleak_end();
    pcVar13 = "%s PASSED\n";
    if (iterator_seek_test()::__test_pass != '\0') {
      pcVar13 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar13,"iterator seek test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x30d);
  iterator_seek_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x30d,"void iterator_seek_test()");
}

Assistant:

void iterator_seek_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1; // retain deletes before compaction

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_seek_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store..
    status = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance to ensure it does not interfere
    for (i=0;i<n;++i){
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv1, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }

    // insert documents of odd number into the main (default) KV store handle
    for (i=1;i<n;i+=2){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents of even number
    for (i=0;i<n;i+=2){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // now odd number docs are in hb-trie & even number docs are in WAL

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek current iterator to inside the WAL's avl tree..
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[0]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[0]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[0]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to 2nd key ..
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // iterator should be able to proceed forward
    status = fdb_iterator_next(iterator);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i++;
    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to the last key.
    status = fdb_iterator_seek(iterator, doc[n-1]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[n-1]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[n-1]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[n-1]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek backward to start key ..
    i = 0;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to key2 ..
    status = fdb_iterator_seek(iterator, doc[2]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=2;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    // Seek backward again to a key in the trie...
    status = fdb_iterator_seek(iterator, doc[3]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=3;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    fdb_iterator_close(iterator);

    // Test fdb_iterator_seek_to_max with key range
    // create an iterator for range of doc[4] ~ doc[8]
    sprintf(keybuf, "key%d", 4); // reuse buffer for start key
    sprintf(metabuf, "key%d", 8); // reuse buffer for end_key
    status = fdb_iterator_init(db, &iterator, keybuf, strlen(keybuf),
                      metabuf, strlen(metabuf),
                      FDB_ITR_NO_DELETES);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 8;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 4;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test fdb_iterator_seek_to_max over full range
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i = n - 1;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 0;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek to max using a non-existent FFFF key
    if (status == FDB_RESULT_SUCCESS) {
        uint8_t *big_seek_key = alca(uint8_t, FDB_MAX_KEYLEN);
        memset(big_seek_key, 0xff, FDB_MAX_KEYLEN);
        status = fdb_iterator_seek(iterator, big_seek_key, FDB_MAX_KEYLEN,
                                   FDB_ITR_SEEK_LOWER);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        i = n - 1;
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // delete documents of even number so WAL only has deleted docs
    for (i=0;i<n;i+=2){
        status = fdb_del(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek forward to 2nd key ..
    rdoc = NULL;
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close the kvs kv1
    fdb_kvs_close(kv1);
    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator seek test");
}